

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 953_alienDictionary.cpp
# Opt level: O2

bool isAlienSorted(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *words,string *order)

{
  bool bVar1;
  mapped_type *pmVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  string word2;
  string word1;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> m;
  string local_a0;
  string local_80;
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  local_60;
  
  word1._M_dataplus._M_p = (pointer)&word1.field_2;
  word1._M_string_length = 0;
  word2._M_dataplus._M_p = (pointer)&word2.field_2;
  word2._M_string_length = 0;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &m._M_t._M_impl.super__Rb_tree_header._M_header;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  word1.field_2._M_local_buf[0] = '\0';
  word2.field_2._M_local_buf[0] = '\0';
  m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar3 = 0; uVar3 < order->_M_string_length; uVar3 = uVar3 + 1) {
    pmVar2 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](&m,(order->_M_dataplus)._M_p + uVar3);
    *pmVar2 = (mapped_type)uVar3;
  }
  uVar3 = 0xffffffffffffffff;
  do {
    uVar4 = ((long)(words->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(words->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
    uVar3 = uVar3 + 1;
    if (uVar4 <= uVar3) break;
    std::__cxx11::string::_M_assign((string *)&word1);
    std::__cxx11::string::_M_assign((string *)&word2);
    std::__cxx11::string::string((string *)&local_80,(string *)&word1);
    std::__cxx11::string::string((string *)&local_a0,(string *)&word2);
    std::
    _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
    ::_Rb_tree(&local_60,&m._M_t);
    bVar1 = isAdjacentSorted(&local_80,&local_a0,
                             (map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                              *)&local_60);
    std::
    _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
    ::~_Rb_tree(&local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
  } while (bVar1);
  std::
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  ::~_Rb_tree(&m._M_t);
  std::__cxx11::string::~string((string *)&word2);
  std::__cxx11::string::~string((string *)&word1);
  return uVar4 <= uVar3;
}

Assistant:

bool isAlienSorted(vector<string>& words, string order) {
    string word1,word2;
	map<char,int> m;
	for (size_t i=0; i<order.length(); i++)
	{
		m[order[i]] = i;
	}
    for (int i=0; i<words.size()-1; i++)
    {
    	word1 = words[i];
    	word2 = words[i+1];
	    if (!isAdjacentSorted(word1,word2,m))
	    	return false;
    }
    return true;
}